

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O0

void __thiscall axl::cry::AppStoreReceipt::clear(AppStoreReceipt *this)

{
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_RDI);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_RDI);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_RDI);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_RDI);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(in_RDI);
  in_RDI[5].super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p = (C *)0x0;
  in_RDI[5].super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_hdr = (BufHdr *)0x0;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x14e7aa);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x14e7bb);
  return;
}

Assistant:

void
AppStoreReceipt::clear() {
	m_bundleId.clear();
	m_appVersion.clear();
	m_originalAppVersion.clear();
	m_receiptCreationDateString.clear();
	m_receiptExpirationDateString.clear();
	m_receiptCreationTimestamp = 0;
	m_receiptExpirationTimestamp = 0;
	m_opaque.clear();
	m_sha1Hash.clear();
}